

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiID *pIVar3;
  byte bVar4;
  ImGuiContext *g;
  ulong uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  byte *pbVar10;
  int iVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  
  pIVar2 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10) == 0) {
    lVar7 = (long)table->SettingsOffset;
    if (lVar7 == -1) {
      pcVar8 = (pIVar2->SettingsTables).Buf.Data;
      if (pcVar8 != (char *)0x0) {
        pIVar3 = (ImGuiID *)(pcVar8 + 4);
        do {
          if (*pIVar3 == table->ID) {
            if (table->ColumnsCount != (int)(char)pIVar3[3]) {
              table->IsSettingsDirty = true;
              pcVar8 = (pIVar2->SettingsTables).Buf.Data;
            }
            table->SettingsOffset = (int)pIVar3 - (int)pcVar8;
            goto LAB_0022eb7b;
          }
          pIVar3 = (ImGuiID *)((long)pIVar3 + (long)(int)pIVar3[-1]);
        } while (pIVar3 != (ImGuiID *)((long)(pIVar2->SettingsTables).Buf.Size + (long)(pcVar8 + 4))
                );
      }
    }
    else {
      pcVar8 = (pIVar2->SettingsTables).Buf.Data;
      pIVar3 = (ImGuiID *)(pcVar8 + lVar7);
      if ((int)pcVar8[lVar7 + 0xd] < table->ColumnsCount) {
        *pIVar3 = 0;
        pIVar3 = (ImGuiID *)0x0;
      }
LAB_0022eb7b:
      table->SettingsLoadedFlags = pIVar3[1];
      table->RefScale = (float)pIVar3[2];
      uVar5 = (ulong)(char)(byte)pIVar3[3];
      if ((long)uVar5 < 1) {
        uVar5 = ~(-1L << ((byte)pIVar3[3] & 0x3f));
        uVar9 = 0;
      }
      else {
        pbVar10 = (byte *)((long)pIVar3 + 0x1b);
        iVar11 = 0;
        uVar9 = 0;
        do {
          uVar13 = (uint)(char)pbVar10[-3];
          uVar14 = (ulong)uVar13;
          if ((-1 < (int)uVar13) && ((int)uVar13 < table->ColumnsCount)) {
            pIVar1 = (table->Columns).Data;
            uVar15 = pIVar3[1];
            if ((uVar15 & 1) != 0) {
              *(undefined4 *)((long)&pIVar1[(int)uVar13].WidthRequest + (ulong)(*pbVar10 & 8)) =
                   *(undefined4 *)(pbVar10 + -0xb);
              pIVar1[(int)uVar13].AutoFitQueue = '\0';
              uVar15 = pIVar3[1];
            }
            if ((uVar15 & 2) != 0) {
              uVar14 = (ulong)pbVar10[-2];
            }
            pIVar1[(int)uVar13].DisplayOrder = (ImGuiTableColumnIdx)uVar14;
            uVar9 = uVar9 | 1L << (uVar14 & 0x3f);
            bVar12 = (bool)(*pbVar10 >> 2 & 1);
            pIVar1[(int)uVar13].IsUserEnabledNextFrame = bVar12;
            pIVar1[(int)uVar13].IsUserEnabled = bVar12;
            pIVar1[(int)uVar13].SortOrder = pbVar10[-1];
            pIVar1[(int)uVar13].field_0x65 = pIVar1[(int)uVar13].field_0x65 & 0xfc | *pbVar10 & 3;
            uVar5 = (ulong)(byte)pIVar3[3];
          }
          iVar11 = iVar11 + 1;
          bVar4 = (byte)uVar5;
          pbVar10 = pbVar10 + 0xc;
        } while (iVar11 < (char)bVar4);
        uVar5 = ~(-1L << (bVar4 & 0x3f));
        if (bVar4 == 0x40) {
          uVar5 = 0xffffffffffffffff;
        }
      }
      iVar11 = table->ColumnsCount;
      if (uVar9 != uVar5) {
        if (iVar11 < 1) {
          return;
        }
        lVar7 = 0x52;
        lVar6 = 0;
        do {
          *(char *)((long)&((table->Columns).Data)->Flags + lVar7) = (char)lVar6;
          lVar6 = lVar6 + 1;
          iVar11 = table->ColumnsCount;
          lVar7 = lVar7 + 0x68;
        } while (lVar6 < iVar11);
      }
      if (0 < iVar11) {
        lVar7 = 0x52;
        lVar6 = 0;
        do {
          (table->DisplayOrderToIndex).Data
          [*(char *)((long)&((table->Columns).Data)->Flags + lVar7)] = (char)lVar6;
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 0x68;
        } while (lVar6 < table->ColumnsCount);
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsUserEnabled = column->IsUserEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}